

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O2

nb_type * __thiscall libDAI::NDP::NBFromVarSet(nb_type *__return_storage_ptr__,NDP *this,VarSet *vs)

{
  int iVar1;
  undefined4 extraout_var;
  reference pvVar2;
  Var *v;
  pointer pVVar3;
  size_t i;
  size_type __n;
  allocator_type local_31;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,
             (long)(vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4,&local_31);
  __n = 0;
  for (pVVar3 = (vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar3 != (vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    iVar1 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[8])(this->_g,pVVar3);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (__return_storage_ptr__,__n);
    *pvVar2 = CONCAT44(extraout_var,iVar1);
    __n = __n + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

nb_type NBFromVarSet(const VarSet & vs) const
            {
                nb_type n(vs.size());
                VarSet::const_iterator it = vs.begin();
                for(size_t i=0; it != vs.end(); it++, i++)
                {
                    const Var & v = *it;
                    size_t vI = _g->findVar(v);
                    n.at(i) = vI;
                }
                return n;
            }